

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marry.c
# Opt level: O2

nng_err nuts_marry_ex(nng_socket s1,nng_socket s2,char *url,nng_pipe *p1,nng_pipe *p2)

{
  char cVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  nng_err nVar7;
  int iVar8;
  nng_time nVar9;
  char *pcVar10;
  size_t __n;
  nng_pipe nVar11;
  char *pcVar12;
  char local_f8 [8];
  char addr [64];
  nng_listener l2;
  int local_9c;
  nng_pipe *pnStack_98;
  int port;
  char *local_90;
  nng_time local_88;
  nng_mtx *local_80;
  marriage_notice note;
  int local_4c;
  int local_48;
  int fd [2];
  nng_listener l;
  
  pnStack_98 = p1;
  unique0x1000054f = url;
  if (url == (char *)0x0) {
    uVar3 = nng_random();
    uVar4 = nng_random();
    uVar5 = nng_random();
    uVar6 = nng_random();
    unique0x00004880 = local_f8;
    snprintf(unique0x00004880,0x40,"inproc://marry%04x%04x%04x%04x",(ulong)uVar3,(ulong)uVar4,
             (ulong)uVar5,uVar6);
  }
  note.s1 = 0;
  note.s2 = 0;
  note.cv._0_4_ = nng_socket_id(s1);
  note.cv._4_4_ = nng_socket_id(s2);
  nVar9 = nng_clock();
  nVar7 = nng_mtx_alloc(&local_80);
  if ((((nVar7 == NNG_OK) && (nVar7 = nng_cv_alloc((nng_cv **)&note,local_80), nVar7 == NNG_OK)) &&
      (nVar7 = nng_pipe_notify(s1,NNG_PIPE_EV_ADD_POST,married,&local_80), nVar7 == NNG_OK)) &&
     (nVar7 = nng_pipe_notify(s2,NNG_PIPE_EV_ADD_POST,married,&local_80), nVar7 == NNG_OK)) {
    local_88 = nVar9;
    iVar8 = strcmp(stack0xffffffffffffffc0,"socket://");
    if (iVar8 == 0) {
      nVar7 = nng_socket_pair(&local_4c);
      if (nVar7 == NNG_ENOTSUP) {
        stack0xffffffffffffffc0 = "tcp://127.0.0.1:0";
      }
      else {
        if (nVar7 != NNG_OK) {
          return nVar7;
        }
        nVar7 = nng_listen(s1,stack0xffffffffffffffc0,(nng_listener *)fd,0);
        if (((nVar7 != NNG_OK) ||
            (nVar7 = nng_listen(s2,stack0xffffffffffffffc0,(nng_listener *)(addr + 0x38),0),
            nVar7 != NNG_OK)) ||
           ((nVar7 = nng_listener_set_int((nng_listener)fd[0],"socket:fd",local_4c), nVar7 != NNG_OK
            || (nVar7 = nng_listener_set_int((nng_listener)addr._56_4_,"socket:fd",local_48),
               nVar7 != NNG_OK)))) {
          close(local_4c);
          close(local_48);
          return nVar7;
        }
      }
    }
    iVar8 = strcmp(stack0xffffffffffffffc0,"socket://");
    if ((iVar8 != 0) &&
       (nVar7 = nng_listen(s1,stack0xffffffffffffffc0,(nng_listener *)fd,0), nVar7 != NNG_OK)) {
      return nVar7;
    }
    pcVar10 = strstr(stack0xffffffffffffffc0,":0");
    pcVar12 = stack0xffffffffffffffc0;
    if ((pcVar10 != (char *)0x0) &&
       (iVar8 = nng_listener_get_int((nng_listener)fd[0],"tcp-bound-port",&local_9c),
       pcVar12 = stack0xffffffffffffffc0, 0 < local_9c && iVar8 == 0)) {
      nVar11.id = 0;
      bVar2 = false;
      while( true ) {
        cVar1 = *stack0xffffffffffffffc0;
        if (cVar1 == '\0') break;
        bVar2 = (bool)(~bVar2 & 1U | cVar1 != '0');
        if (bVar2) {
          local_f8[(int)nVar11.id] = cVar1;
          iVar8 = 1;
        }
        else {
          pcVar12 = addr + 0x38;
          note.p2.id = nVar11.id;
          snprintf(pcVar12,0x10,"%d");
          local_90 = local_f8 + (int)nVar11.id;
          __n = strlen(pcVar12);
          iVar8 = (int)__n;
          memcpy(local_90,pcVar12,__n);
          nVar11 = note.p2;
        }
        bVar2 = bVar2 && cVar1 == ':';
        nVar11.id = nVar11.id + iVar8;
        unique0x00006b80 = stack0xffffffffffffffc0 + 1;
      }
      local_f8[(int)nVar11.id] = '\0';
      pcVar12 = local_f8;
    }
    nVar7 = nng_socket_set_ms(s2,"reconnect-time-min",10);
    if (((nVar7 == NNG_OK) &&
        (nVar7 = nng_socket_set_ms(s2,"reconnect-time-max",10), nVar7 == NNG_OK)) &&
       ((iVar8 = strcmp(pcVar12,"socket://"), iVar8 == 0 ||
        (nVar7 = nng_dial(s2,pcVar12,(nng_dialer *)0x0,0), nVar7 == NNG_OK)))) {
      nVar9 = local_88 + 1000;
      nng_mtx_lock(local_80);
      do {
        if ((note.s1 != 0) && (note.s2 != 0)) {
          nVar7 = NNG_OK;
          break;
        }
        nVar7 = nng_cv_until((nng_cv *)note.mx,nVar9);
      } while (nVar7 == NNG_OK);
      nng_mtx_unlock(local_80);
      if (pnStack_98 != (nng_pipe *)0x0) {
        pnStack_98->id = note.cnt1;
      }
      if (p2 != (nng_pipe *)0x0) {
        p2->id = note.cnt2;
      }
    }
  }
  nng_pipe_notify(s1,NNG_PIPE_EV_ADD_POST,(nng_pipe_cb)0x0,(void *)0x0);
  nng_pipe_notify(s2,NNG_PIPE_EV_ADD_POST,(nng_pipe_cb)0x0,(void *)0x0);
  if (note.mx != (nng_mtx *)0x0) {
    nng_cv_free((nng_cv *)note.mx);
  }
  if (local_80 != (nng_mtx *)0x0) {
    nng_mtx_free(local_80);
  }
  return nVar7;
}

Assistant:

nng_err
nuts_marry_ex(
    nng_socket s1, nng_socket s2, const char *url, nng_pipe *p1, nng_pipe *p2)
{
	struct marriage_notice note;
	nng_time               timeout;
	nng_err                rv;
	char                   addr[64];
	nng_listener           l;
	int                    port;
	int                    fd[2];

	if (url == NULL) {
		(void) snprintf(addr, sizeof(addr),
		    "inproc://marry%04x%04x%04x%04x", nng_random(),
		    nng_random(), nng_random(), nng_random());
		url = addr;
	}

	note.cnt1 = 0;
	note.cnt2 = 0;
	note.s1   = nng_socket_id(s1);
	note.s2   = nng_socket_id(s2);
	timeout   = nng_clock() + 1000; // 1 second

	if (((rv = nng_mtx_alloc(&note.mx)) != 0) ||
	    ((rv = nng_cv_alloc(&note.cv, note.mx)) != 0) ||
	    ((rv = nng_pipe_notify(
	          s1, NNG_PIPE_EV_ADD_POST, married, &note)) != 0) ||
	    ((rv = nng_pipe_notify(
	          s2, NNG_PIPE_EV_ADD_POST, married, &note)) != 0)) {
		goto done;
	}

	// If socket:// is requested we will try to use that, otherwise we
	// fake it with a TCP loopback socket.
	if (strcmp(url, "socket://") == 0) {
		rv = nng_socket_pair(fd);
		if (rv == 0) {
			nng_listener l2;
			if (((rv = nng_listen(s1, url, &l, 0)) != 0) ||
			    ((rv = nng_listen(s2, url, &l2, 0)) != 0) ||
			    ((rv = nng_listener_set_int(
			          l, NNG_OPT_SOCKET_FD, fd[0])) != 0) ||
			    ((rv = nng_listener_set_int(
			          l2, NNG_OPT_SOCKET_FD, fd[1])) != 0)) {
#ifdef _WIN32
				_close(fd[0]);
				_close(fd[1]);
#else
				close(fd[0]);
				close(fd[1]);
#endif
				return (rv);
			}
		} else if (rv == NNG_ENOTSUP) {
			url = "tcp://127.0.0.1:0";
			rv  = NNG_OK;
		} else {
			return (rv);
		}
	}

	if (strcmp(url, "socket://") != 0) {
		if ((rv = nng_listen(s1, url, &l, 0)) != 0) {
			return (rv);
		}
	}
	if ((strstr(url, ":0") != NULL) &&
	    // If a TCP port of zero was selected, let's ask for the actual
	    // port bound.
	    (nng_listener_get_int(l, NNG_OPT_TCP_BOUND_PORT, &port) == 0) &&
	    (port > 0)) {
		replace_port_zero(url, addr, port);
		url = addr;
	}
	if (((rv = nng_socket_set_ms(s2, NNG_OPT_RECONNMINT, 10)) != 0) ||
	    ((rv = nng_socket_set_ms(s2, NNG_OPT_RECONNMAXT, 10)) != 0)) {
		goto done;
	}
	if ((strcmp(url, "socket://") != 0) &&
	    ((rv = nng_dial(s2, url, NULL, 0)) != 0)) {
		goto done;
	}

	nng_mtx_lock(note.mx);
	while ((note.cnt1 == 0) || (note.cnt2 == 0)) {
		if ((rv = nng_cv_until(note.cv, timeout)) != 0) {
			break;
		}
	}
	nng_mtx_unlock(note.mx);
	if (p1 != NULL) {
		*p1 = note.p1;
	}
	if (p2 != NULL) {
		*p2 = note.p2;
	}

done:
	nng_pipe_notify(s1, NNG_PIPE_EV_ADD_POST, NULL, NULL);
	nng_pipe_notify(s2, NNG_PIPE_EV_ADD_POST, NULL, NULL);
	if (note.cv != NULL) {
		nng_cv_free(note.cv);
	}
	if (note.mx != NULL) {
		nng_mtx_free(note.mx);
	}
	return (rv);
}